

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

Time __thiscall L11_1::Time::sum(Time *this,Time *t)

{
  Time *t_local;
  Time *this_local;
  Time total;
  
  Time((Time *)&this_local);
  reset((Time *)&this_local,this->hour,this->minute);
  addHour((Time *)&this_local,t->hour);
  addMin((Time *)&this_local,t->minute);
  return (Time)this_local;
}

Assistant:

Time Time::sum(const Time &t) const {
    //  局部变量存储 sum
    Time total;
    total.reset(hour, minute);
    total.addHour(t.hour);
    total.addMin(t.minute);
    //  实际上返回了该局部变量的拷贝供函数外使用，原本局部变量被删除
    return total;
}